

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O0

RatioSequence * __thiscall RatioSequence::getNonDesRSWithMinDist(RatioSequence *this)

{
  size_t sVar1;
  Ratio *pRVar2;
  reference pvVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *this_00;
  value_type *in_RSI;
  RatioSequence *in_RDI;
  bool bVar5;
  double dVar6;
  double dVar7;
  size_t k;
  Ratio combinedRatio;
  int a;
  vector<int,_std::allocator<int>_> ccArray;
  long combineCode;
  size_t i;
  RatioSequence *combinedRS;
  vector<Ratio,_std::allocator<Ratio>_> *in_stack_fffffffffffffe78;
  Ratio *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe88;
  value_type_conflict2 *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  RatioSequence *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  Ratio *in_stack_fffffffffffffeb8;
  vector<Ratio,_std::allocator<Ratio>_> *in_stack_ffffffffffffff40;
  undefined1 *puVar8;
  undefined1 *__n;
  iterator in_stack_ffffffffffffff48;
  int local_58;
  vector<int,_std::allocator<int>_> local_40;
  long local_28;
  ulong local_20;
  byte local_11;
  
  sVar1 = size((RatioSequence *)0x1fd5ef);
  if (sVar1 < 2) {
    RatioSequence(in_stack_fffffffffffffea0,
                  (RatioSequence *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  }
  else {
    local_11 = 0;
    RatioSequence(in_stack_fffffffffffffea0,
                  (RatioSequence *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    local_20 = 0;
    local_28 = 0;
    size((RatioSequence *)0x1fd651);
    std::allocator<int>::allocator((allocator<int> *)0x1fd67b);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::allocator<int>::~allocator((allocator<int> *)0x1fd6af);
    local_58 = 0;
    while (uVar4 = local_20, sVar1 = size((RatioSequence *)0x1fd6d7), uVar4 < sVar1 - 1) {
      pRVar2 = operator[]((RatioSequence *)in_stack_fffffffffffffe80,
                          (size_t)in_stack_fffffffffffffe78);
      dVar6 = Ratio::getRatio(pRVar2);
      pRVar2 = operator[]((RatioSequence *)in_stack_fffffffffffffe80,
                          (size_t)in_stack_fffffffffffffe78);
      dVar7 = Ratio::getRatio(pRVar2);
      if (dVar6 <= dVar7) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_58);
        *pvVar3 = 0;
        local_20 = local_20 + 1;
        while( true ) {
          uVar4 = (ulong)local_58;
          sVar1 = size((RatioSequence *)0x1fda43);
          bVar5 = false;
          if (uVar4 < sVar1 - 1) {
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_58);
            bVar5 = *pvVar3 != 2;
          }
          if (!bVar5) break;
          local_58 = local_58 + 1;
        }
      }
      else {
        operator[]((RatioSequence *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
        operator[]((RatioSequence *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
        Ratio::combine(in_stack_fffffffffffffeb8,
                       (Ratio *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
        erase((RatioSequence *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
        erase((RatioSequence *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
        std::vector<Ratio,_std::allocator<Ratio>_>::begin(in_stack_fffffffffffffe78);
        __gnu_cxx::__normal_iterator<Ratio_*,_std::vector<Ratio,_std::allocator<Ratio>_>_>::
        operator+((__normal_iterator<Ratio_*,_std::vector<Ratio,_std::allocator<Ratio>_>_> *)
                  in_stack_fffffffffffffe88,(difference_type)in_stack_fffffffffffffe80);
        __gnu_cxx::__normal_iterator<Ratio_const*,std::vector<Ratio,std::allocator<Ratio>>>::
        __normal_iterator<Ratio*>
                  ((__normal_iterator<const_Ratio_*,_std::vector<Ratio,_std::allocator<Ratio>_>_> *)
                   in_stack_fffffffffffffe80,
                   (__normal_iterator<Ratio_*,_std::vector<Ratio,_std::allocator<Ratio>_>_> *)
                   in_stack_fffffffffffffe78);
        in_stack_ffffffffffffff48 =
             std::vector<Ratio,_std::allocator<Ratio>_>::insert
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff48._M_current,in_RSI);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_58);
        *pvVar3 = 1;
        if (local_20 == 0) {
          while( true ) {
            in_stack_fffffffffffffeb8 = (Ratio *)(long)local_58;
            sVar1 = size((RatioSequence *)0x1fd98a);
            bVar5 = false;
            if (in_stack_fffffffffffffeb8 < (Ratio *)(sVar1 - 1)) {
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_58);
              bVar5 = *pvVar3 != 2;
            }
            if (!bVar5) break;
            local_58 = local_58 + 1;
          }
          in_stack_fffffffffffffeb7 = 0;
        }
        else {
          local_20 = local_20 - 1;
          while (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_40,(long)local_58), *pvVar3 == 1) {
            local_58 = local_58 + -1;
          }
        }
        Ratio::~Ratio(in_stack_fffffffffffffe80);
      }
    }
    puVar8 = (undefined1 *)0x0;
    while (__n = puVar8,
          this_00 = (vector<int,_std::allocator<int>_> *)size((RatioSequence *)0x1fdacc),
          puVar8 < (undefined1 *)
                   ((long)&this_00[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7U)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(size_type)__n);
      if (*pvVar3 == 1) {
        in_stack_fffffffffffffe80 =
             (Ratio *)std::pow<int,unsigned_long>
                                ((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                                 (unsigned_long)in_stack_fffffffffffffe78);
        local_28 = (long)((double)local_28 + (double)in_stack_fffffffffffffe80);
      }
      puVar8 = __n + 1;
    }
    setCombineCode(in_RDI,local_28);
    local_11 = 1;
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    if ((local_11 & 1) == 0) {
      ~RatioSequence((RatioSequence *)0x1fdba8);
    }
  }
  return in_RDI;
}

Assistant:

RatioSequence RatioSequence::getNonDesRSWithMinDist() {
    if (this->size() < 2) {
        return *this;
    }
    RatioSequence combinedRS(*this);
    size_t i = 0;   // index for stepping through rs
    long combineCode = 0;
    vector<int> ccArray(this->size(), 0);

    int a = 0; // array index

    while (i < combinedRS.size() - 1) {
        if (combinedRS[i].getRatio() > combinedRS[i + 1].getRatio()) {
            Ratio combinedRatio = Ratio::combine(combinedRS[i], combinedRS[i + 1]);
            combinedRS.erase(i);
            combinedRS.erase(i);
            combinedRS._RatioSequence.insert(combinedRS._RatioSequence.begin() + i, combinedRatio);
            ccArray[a] = 1;
            if (i > 0) {
                i--;
                // go back in the array to the last non-combined ratio
                while (ccArray[a] == 1) {
                    a--;
                }
            } else {
                // we must advance a
                while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                    a++;
                }
            }
        } else {
            ccArray[a] = 0;
            // the ratios are not-descending, so go on to the next pair
            i++;
            // we must jump ahead to the next ratio not considered for combination
            while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                a++;
            }
        }
    }

    for (size_t k = 0; k < this->size() - 1; k++) {
        if (ccArray[k] == 1) {
            combineCode += pow(2, k);
        }
    }
    combinedRS.setCombineCode(combineCode);

    return combinedRS;
}